

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

int pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  
  mbedtls_md5_init(&md5_ctx);
  iVar2 = mbedtls_md5_starts_ret(&md5_ctx);
  if ((((iVar2 == 0) && (iVar2 = mbedtls_md5_update_ret(&md5_ctx,pwd,pwdlen), iVar2 == 0)) &&
      (iVar2 = mbedtls_md5_update_ret(&md5_ctx,iv,8), iVar2 == 0)) &&
     (iVar2 = mbedtls_md5_finish_ret(&md5_ctx,md5sum), iVar2 == 0)) {
    if (0x10 < keylen) {
      *(undefined8 *)key = md5sum._0_8_;
      *(undefined8 *)(key + 8) = md5sum._8_8_;
      iVar2 = mbedtls_md5_starts_ret(&md5_ctx);
      if (((iVar2 != 0) || (iVar2 = mbedtls_md5_update_ret(&md5_ctx,md5sum,0x10), iVar2 != 0)) ||
         ((iVar2 = mbedtls_md5_update_ret(&md5_ctx,pwd,pwdlen), iVar2 != 0 ||
          ((iVar2 = mbedtls_md5_update_ret(&md5_ctx,iv,8), iVar2 != 0 ||
           (iVar2 = mbedtls_md5_finish_ret(&md5_ctx,md5sum), iVar2 != 0)))))) goto LAB_001216a8;
      sVar1 = keylen - 0x10;
      bVar3 = keylen < 0x20;
      keylen = 0x10;
      if (bVar3) {
        keylen = sVar1;
      }
      key = key + 0x10;
    }
    memcpy(key,md5sum,keylen);
    iVar2 = 0;
  }
LAB_001216a8:
  mbedtls_md5_free(&md5_ctx);
  mbedtls_platform_zeroize(md5sum,0x10);
  return iVar2;
}

Assistant:

static int pem_pbkdf1( unsigned char *key, size_t keylen,
                       unsigned char *iv,
                       const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv,  8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );
        goto exit;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, md5sum, 16 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

exit:
    mbedtls_md5_free( &md5_ctx );
    mbedtls_platform_zeroize( md5sum, 16 );

    return( ret );
}